

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketcan-cyclic-demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  __sighandler_t p_Var3;
  __u8 *p_Var4;
  ssize_t sVar5;
  int *piVar6;
  long lVar7;
  char *pcVar8;
  ifreq ifr;
  sockaddr_can addr;
  can_msg msg;
  
  if (argc < 2) {
    pcVar8 = "Too few arguments!\n";
  }
  else {
    iVar1 = getopt(argc,argv,"hv");
    if (iVar1 != -1) {
      if (iVar1 == 0x76) {
        puts("socketcan-bcm-demo 1.0.0\n");
        return 0;
      }
      if (iVar1 == 0x68) {
        usage();
        return 0;
      }
      goto LAB_00101405;
    }
    if (_optind == argc - 1U) {
      pcVar8 = argv[_optind];
      p_Var3 = signal(2,onsig);
      if (((p_Var3 == (__sighandler_t)0xffffffffffffffff) ||
          (p_Var3 = signal(0xf,onsig), p_Var3 == (__sighandler_t)0xffffffffffffffff)) ||
         (p_Var3 = signal(0x11,(__sighandler_t)0x1), p_Var3 == (__sighandler_t)0xffffffffffffffff))
      {
        pcVar8 = "socketcan-bcm-demo";
      }
      else {
        iVar1 = socket(0x1d,2,2);
        if (iVar1 < 0) {
          pcVar8 = "socketcan-bcm-demo: socket";
        }
        else {
          strncpy((char *)&ifr,pcVar8,0x10);
          iVar2 = ioctl(iVar1,0x8933,&ifr);
          if (iVar2 < 0) {
            pcVar8 = "socketcan-bcm-demo: ioctl";
          }
          else {
            addr.can_family = 0x1d;
            addr.can_ifindex = ifr.ifr_ifru.ifru_ivalue;
            iVar2 = connect(iVar1,(sockaddr *)&addr,0x18);
            if (iVar2 < 0) {
              pcVar8 = "socketcan-bcm-demo: connect";
            }
            else {
              sigval = 0;
              p_Var4 = msg.frame[0].data;
              msg.msg_head.opcode = 1;
              msg.msg_head.can_id = 0;
              msg.msg_head.nframes = 4;
              msg.msg_head.flags = 3;
              msg.msg_head.count = 0;
              msg.msg_head.ival2.tv_sec = 1;
              msg.msg_head.ival2.tv_usec = 200000;
              for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
                ((can_frame *)(p_Var4 + -8))->can_id = (uint)lVar7 | 0xc0;
                ((anon_union_1_2_9a79380a_for_can_frame_1 *)(p_Var4 + -4))->len = '\x03';
                iVar2 = ((uint)lVar7 & 0xff) * 0x101;
                *(short *)p_Var4 = (short)iVar2;
                p_Var4[2] = (__u8)iVar2;
                p_Var4 = p_Var4 + 0x10;
              }
              sVar5 = write(iVar1,&msg,0x78);
              if (sVar5 < 0) {
                pcVar8 = "socketcan-bcm-demo: write: TX_SETUP";
              }
              else {
                printf("Cyclic messages registed with SocketCAN!\nUse a tool such as \"candump %s\" to view the messages.\nThese messages will continue to transmit so long as the socket\nused to communicate with SocketCAN remains open. In other words,\nclose this program with SIGINT or SIGTERM in order to gracefully\nstop transmitting.\n"
                       ,pcVar8);
                while (sigval == 0) {
                  usleep(10000);
                }
                puts("\nGoodbye!");
                iVar1 = close(iVar1);
                if (-1 < iVar1) {
                  return 0;
                }
                pcVar8 = "socketcan-bcm-demo: close";
              }
            }
          }
        }
      }
      perror(pcVar8);
      piVar6 = __errno_location();
      return *piVar6;
    }
    pcVar8 = "Only one interface may be used!\n";
  }
  fputs(pcVar8,_stderr);
LAB_00101405:
  usage();
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned int i;
    int opt;
    int s;
    char *iface;
    struct sockaddr_can addr;
    struct ifreq ifr;
    
    struct can_msg
    {
        struct bcm_msg_head msg_head;
        struct can_frame frame[NFRAMES];
    } msg;

    /* Check if at least one argument was specified */
    if (argc < 2)
    {
        fputs("Too few arguments!\n", stderr);
        usage();
        return EXIT_FAILURE;
    }

    /* Parse command line options */
    while ((opt = getopt(argc, argv, "hv")) != -1)
    {
        switch (opt)
        {
        case 'h':
            usage();
            return EXIT_SUCCESS;
        case 'v':
            version();
            return EXIT_SUCCESS;
        default:
            usage();
            return EXIT_FAILURE;
        }
    }

    /* Exactly one command line argument must remain; the interface to use */
    if (optind == (argc - 1))
    {
        iface = argv[optind];
    }
    else
    {
        fputs("Only one interface may be used!\n", stderr);
        usage();
        return EXIT_FAILURE;
    }

    /* Register signal handlers */
    if (signal(SIGINT, onsig)    == SIG_ERR ||
        signal(SIGTERM, onsig)   == SIG_ERR ||
        signal(SIGCHLD, SIG_IGN) == SIG_ERR)
    {
        perror(PROGNAME);
        return errno;
    }

    /* Open the CAN interface */
    s = socket(PF_CAN, SOCK_DGRAM, CAN_BCM);
    if (s < 0)
    {
        perror(PROGNAME ": socket");
        return errno;
    }

    strncpy(ifr.ifr_name, iface, IFNAMSIZ);
    if (ioctl(s, SIOCGIFINDEX, &ifr) < 0)
    {
        perror(PROGNAME ": ioctl");
        return errno;
    }

    addr.can_family = AF_CAN;
    addr.can_ifindex = ifr.ifr_ifindex;
    if (connect(s, (struct sockaddr *)&addr, sizeof(addr)) < 0)
    {
        perror(PROGNAME ": connect");
        return errno;
    }

    /* Setup code */
    sigval = 0;

    /* Set up cyclic messages. Note that both SETTIMER and STARTTIMER are
     * required as flags in order to continue transmitting.
     */
    msg.msg_head.opcode  = TX_SETUP;
    msg.msg_head.can_id  = 0;
    msg.msg_head.flags   = SETTIMER | STARTTIMER;
    msg.msg_head.nframes = NFRAMES;
    msg.msg_head.count   = 0;

    /* Set the time interval value to 1200 ms */
    msg.msg_head.ival2.tv_sec = 1;
    msg.msg_head.ival2.tv_usec = 200000;

    /* Create the example messages */
    for (i = 0; i < NFRAMES; ++i)
    {
        struct can_frame * const frame = msg.frame + i;
        frame->can_id = MSGID + i;
        frame->can_dlc = MSGLEN;
        memset(frame->data, i, MSGLEN);
    }

    /* Register the cyclic messages. Note that all of the messages in the msg
     * struct will be sent with the same periodicity because they share the
     * same bcm_msg_head setup data.
     */
    if (write(s, &msg, sizeof(msg)) < 0)
    {
        perror(PROGNAME ": write: TX_SETUP");
        return errno;
    }

    printf("Cyclic messages registed with SocketCAN!\n"
           "Use a tool such as \"candump %s\" to view the messages.\n"
           "These messages will continue to transmit so long as the socket\n"
           "used to communicate with SocketCAN remains open. In other words,\n"
           "close this program with SIGINT or SIGTERM in order to gracefully\n"
           "stop transmitting.\n",
           iface);

    /* Spin forever here */
    while (0 == sigval) usleep(DELAY);

    puts("\nGoodbye!");

    /* Close the CAN interface */
    if (close(s) < 0)
    {
        perror(PROGNAME ": close");
        return errno;
    }

    return EXIT_SUCCESS;
}